

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tufted_laplacian.cpp
# Opt level: O1

void geometrycentral::surface::buildIntrinsicTuftedCover
               (SurfaceMesh *mesh,EdgeData<double> *edgeLengths,EmbeddedGeometryInterface *posGeom)

{
  Vector3 *pVVar1;
  unsigned_long uVar2;
  Vector3 *pVVar3;
  double *pdVar4;
  SurfaceMesh *pSVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  iterator __last;
  EdgeData<double> *pEVar8;
  uint uVar9;
  size_t i_5;
  ParentMeshT *pPVar10;
  ulong uVar11;
  size_t i_1;
  unsigned_long uVar12;
  ParentMeshT *pPVar13;
  pointer puVar14;
  size_t sVar15;
  pointer puVar16;
  size_t i_8;
  size_t sVar17;
  ParentMeshT *pPVar18;
  pointer puVar19;
  uint uVar20;
  ulong uVar21;
  size_t i_3;
  size_t sVar22;
  size_t sVar23;
  double dVar24;
  size_t i;
  long lVar25;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  __last_00;
  ulong uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  Face FVar52;
  Edge EVar53;
  Halfedge heA;
  Halfedge heB;
  vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>
  edgeFaces;
  Halfedge he;
  Vector3 pTail;
  anon_class_24_3_ca2f44c0 edgeAngle;
  HalfedgeData<Halfedge> otherSheet;
  FaceData<bool> isFront;
  EdgeData<bool> isOrigEdge;
  __normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
  local_1c8;
  iterator iStack_1c0;
  Halfedge *local_1b8;
  undefined1 local_1a8 [16];
  double local_198;
  double local_190;
  double local_188;
  EmbeddedGeometryInterface *local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  size_t local_158;
  EdgeData<double> *local_150;
  Halfedge local_148;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double dStack_110;
  double local_108;
  EmbeddedGeometryInterface **local_f8;
  double *local_f0;
  Halfedge *local_e8;
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge> local_e0;
  MeshData<geometrycentral::surface::Face,_bool> local_a0;
  MeshData<geometrycentral::surface::Edge,_bool> local_68;
  
  local_180 = posGeom;
  if (posGeom != (EmbeddedGeometryInterface *)0x0) {
    EmbeddedGeometryInterface::requireVertexPositions(posGeom);
    EmbeddedGeometryInterface::requireFaceNormals(local_180);
  }
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::MeshData
            (&local_e0,mesh);
  MeshData<geometrycentral::surface::Face,_bool>::MeshData(&local_a0,mesh,true);
  sVar15 = mesh->nFacesFillCount;
  if ((sVar15 == 0) ||
     (puVar14 = (mesh->fHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start, *puVar14 != 0xffffffffffffffff)) {
    sVar23 = 0;
  }
  else {
    sVar22 = 0;
    do {
      sVar23 = sVar15;
      if (sVar15 - 1 == sVar22) break;
      sVar23 = sVar22 + 1;
      lVar25 = sVar22 + 1;
      sVar22 = sVar23;
    } while (puVar14[lVar25] == 0xffffffffffffffff);
  }
  local_150 = edgeLengths;
  if (sVar23 != sVar15) {
    do {
      if (local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[sVar23] == true) {
        FVar52.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
        ind = sVar23;
        FVar52.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
        mesh = mesh;
        FVar52 = SurfaceMesh::duplicateFace(mesh,FVar52);
        pPVar10 = FVar52.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .mesh;
        uVar12 = (mesh->fHalfedgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar23];
        puVar14 = (pPVar10->fHalfedgeArr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  FVar52.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .ind;
        do {
          uVar2 = *puVar14;
          local_e0.data.
          super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar12].
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = pPVar10;
          local_e0.data.
          super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar12].
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = uVar2;
          local_e0.data.
          super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar2].
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = mesh;
          local_e0.data.
          super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
          .m_storage.m_data[uVar2].
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = uVar12;
          uVar12 = (mesh->heNextArr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
          puVar14 = (pPVar10->heNextArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + uVar2;
        } while (uVar12 != (mesh->fHalfedgeArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[sVar23]);
        SurfaceMesh::invertOrientation(mesh,FVar52);
        local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.m_data
        [FVar52.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
         .ind] = false;
      }
      sVar22 = sVar23;
      do {
        sVar23 = sVar15;
        if (sVar15 - 1 == sVar22) break;
        sVar23 = sVar22 + 1;
        lVar25 = sVar22 + 1;
        sVar22 = sVar23;
      } while ((mesh->fHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar25] == 0xffffffffffffffff);
    } while (sVar23 != sVar15);
  }
  MeshData<geometrycentral::surface::Edge,_bool>::MeshData(&local_68,mesh,true);
  sVar15 = mesh->nEdgesFillCount;
  if (sVar15 != 0) {
    puVar14 = (mesh->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar16 = (mesh->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar19 = puVar16;
    if (mesh->useImplicitTwinFlag != false) {
      puVar19 = puVar14;
    }
    if (*puVar19 == 0xffffffffffffffff) {
      sVar23 = 0;
      do {
        puVar16 = puVar16 + 1;
        puVar14 = puVar14 + 2;
        sVar22 = sVar15;
        if (sVar15 - 1 == sVar23) break;
        puVar19 = puVar16;
        if (mesh->useImplicitTwinFlag != false) {
          puVar19 = puVar14;
        }
        sVar23 = sVar23 + 1;
        sVar22 = sVar23;
      } while (*puVar19 == 0xffffffffffffffff);
      goto LAB_001ab2c2;
    }
  }
  sVar22 = 0;
LAB_001ab2c2:
  if (sVar22 != sVar15) {
    sVar23 = sVar15 - 1;
    local_158 = sVar15;
    do {
      if (local_68.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
          m_data[sVar22] == true) {
        local_1c8._M_current = (Halfedge *)0x0;
        iStack_1c0._M_current = (Halfedge *)0x0;
        local_1b8 = (Halfedge *)0x0;
        if (mesh->useImplicitTwinFlag == true) {
          dVar24 = (double)(sVar22 * 2);
          dVar30 = dVar24;
        }
        else {
          dVar24 = (double)(mesh->eHalfedgeArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[sVar22];
          dVar30 = dVar24;
        }
        do {
          local_148.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          mesh = mesh;
          local_148.
          super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.
          ind = (size_t)dVar24;
          if (local_a0.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
              m_data[(mesh->heFaceArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[(long)dVar24]] == true) {
            if (iStack_1c0._M_current == local_1b8) {
              ::std::
              vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>
              ::_M_realloc_insert<geometrycentral::surface::Halfedge_const&>
                        ((vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>
                          *)&local_1c8,iStack_1c0,&local_148);
            }
            else {
              ((iStack_1c0._M_current)->
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              ).mesh = mesh;
              ((iStack_1c0._M_current)->
              super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
              ).ind = (size_t)dVar24;
              iStack_1c0._M_current = iStack_1c0._M_current + 1;
            }
          }
          if (mesh->useImplicitTwinFlag == true) {
            dVar24 = (double)((ulong)dVar24 ^ 1);
          }
          else {
            dVar24 = (double)(mesh->heSiblingArr).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[(long)dVar24];
          }
        } while (dVar24 != dVar30);
        if (local_180 != (EmbeddedGeometryInterface *)0x0) {
          if (mesh->useImplicitTwinFlag == true) {
            uVar12 = sVar22 * 2;
          }
          else {
            uVar12 = (mesh->eHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar22];
          }
          puVar14 = (mesh->heVertexArr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar12 = puVar14[uVar12];
          pVVar3 = (local_180->vertexPositions).data.
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::Vector3,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data;
          local_108 = pVVar3[uVar12].z;
          pVVar1 = pVVar3 + uVar12;
          local_118 = pVVar1->x;
          dStack_110 = pVVar1->y;
          auVar45._0_8_ = pVVar1->x;
          auVar45._8_8_ = pVVar1->y;
          if (mesh->useImplicitTwinFlag == false) {
            uVar12 = (mesh->eHalfedgeArr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[sVar22];
          }
          else {
            uVar12 = sVar22 * 2;
          }
          uVar12 = puVar14[(mesh->heNextArr).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar12]];
          dVar24 = pVVar3[uVar12].z - local_108;
          auVar27._0_8_ = pVVar3[uVar12].x;
          auVar27._8_8_ = pVVar3[uVar12].y;
          auVar27 = vsubpd_avx(auVar27,auVar45);
          auVar32._0_8_ = auVar27._0_8_ * auVar27._0_8_;
          auVar32._8_8_ = auVar27._8_8_ * auVar27._8_8_;
          auVar45 = vshufpd_avx(auVar32,auVar32,1);
          auVar45 = vfmadd231sd_fma(auVar45,auVar27,auVar27);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar24;
          auVar45 = vfmadd231sd_fma(auVar45,auVar36,auVar36);
          if (auVar45._0_8_ < 0.0) {
            local_1a8._0_8_ = dVar24;
            local_178 = auVar27;
            dVar30 = sqrt(auVar45._0_8_);
            auVar27 = local_178;
            dVar24 = (double)local_1a8._0_8_;
          }
          else {
            auVar45 = vsqrtsd_avx(auVar45,auVar45);
            dVar30 = auVar45._0_8_;
          }
          dVar30 = 1.0 / dVar30;
          auVar41._0_8_ = auVar27._0_8_ * dVar30;
          auVar41._8_8_ = auVar27._8_8_ * dVar30;
          dVar24 = dVar24 * dVar30;
          auVar45 = vshufpd_avx(auVar41,auVar41,1);
          auVar33._8_8_ = 0;
          auVar33._0_8_ = auVar41._0_8_ + auVar45._0_8_ * 0.0;
          auVar43._8_8_ = 0;
          auVar43._0_8_ = dVar24;
          auVar27 = vfmadd231sd_fma(auVar33,auVar43,ZEXT816(0) << 0x40);
          auVar6._8_8_ = 0x7fffffffffffffff;
          auVar6._0_8_ = 0x7fffffffffffffff;
          auVar27 = vandpd_avx512vl(auVar27,auVar6);
          bVar7 = 0.9 < auVar27._0_8_;
          dVar30 = (double)((ulong)!bVar7 * 0x3ff0000000000000);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = dVar30;
          dVar48 = (double)((ulong)bVar7 * 0x3ff0000000000000);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = dVar48;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = auVar45._0_8_ * -0.0;
          auVar27 = vfmadd231sd_fma(auVar39,auVar29,auVar43);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = dVar24 * dVar30;
          auVar32 = vfmsub231sd_fma(auVar46,auVar41,ZEXT816(0) << 0x40);
          dVar30 = auVar32._0_8_;
          auVar49._8_8_ = 0;
          auVar49._0_8_ = auVar41._0_8_ * dVar48;
          auVar36 = vfmsub231sd_fma(auVar49,auVar45,auVar28);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = dVar30 * dVar30;
          auVar32 = vfmadd231sd_fma(auVar34,auVar27,auVar27);
          auVar32 = vfmadd231sd_fma(auVar32,auVar36,auVar36);
          if (auVar32._0_8_ < 0.0) {
            local_178._0_8_ = dVar24;
            local_1a8 = auVar41;
            local_198 = auVar36._0_8_;
            local_190 = dVar30;
            local_188 = auVar27._0_8_;
            local_168 = auVar45;
            dVar31 = sqrt(auVar32._0_8_);
            dVar38 = local_188;
            dVar30 = local_190;
            dVar48 = local_198;
            auVar45 = local_168;
            auVar41 = local_1a8;
            dVar24 = (double)local_178._0_8_;
          }
          else {
            auVar32 = vsqrtsd_avx(auVar32,auVar32);
            dVar31 = auVar32._0_8_;
            dVar38 = auVar27._0_8_;
            dVar48 = auVar36._0_8_;
          }
          auVar42._8_8_ = 0;
          auVar42._0_8_ = dVar24;
          dVar31 = 1.0 / dVar31;
          pSVar5 = (SurfaceMesh *)(dVar31 * dVar38);
          dVar30 = dVar31 * dVar30;
          dVar48 = dVar48 * dVar31;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = dVar30 * dVar24;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = dVar48;
          auVar27 = vfmsub231sd_fma(auVar37,auVar45,auVar50);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = pSVar5;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = dVar48 * auVar41._0_8_;
          auVar32 = vfmsub231sd_fma(auVar51,auVar40,auVar42);
          dVar24 = auVar32._0_8_;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = (double)pSVar5 * auVar45._0_8_;
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar30;
          auVar32 = vfmsub231sd_fma(auVar44,auVar47,auVar41);
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar24 * dVar24;
          auVar45 = vfmadd231sd_fma(auVar35,auVar27,auVar27);
          auVar45 = vfmadd231sd_fma(auVar45,auVar32,auVar32);
          if (auVar45._0_8_ < 0.0) {
            local_1a8._0_8_ = pSVar5;
            local_178._0_8_ = dVar30;
            local_168._0_8_ = dVar48;
            local_198 = auVar32._0_8_;
            local_190 = dVar24;
            local_188 = auVar27._0_8_;
            local_120 = sqrt(auVar45._0_8_);
            local_130 = local_188;
            dVar24 = local_190;
            dVar38 = local_198;
            local_148.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind = local_178._0_8_;
            local_138 = (double)local_168._0_8_;
            local_148.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh = (ParentMeshT *)local_1a8._0_8_;
          }
          else {
            auVar45 = vsqrtsd_avx(auVar45,auVar45);
            local_120 = auVar45._0_8_;
            local_130 = auVar27._0_8_;
            dVar38 = auVar32._0_8_;
            local_148.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind = (size_t)dVar30;
            local_138 = dVar48;
            local_148.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh = pSVar5;
          }
          __last._M_current = (Halfedge *)iStack_1c0;
          local_120 = 1.0 / local_120;
          local_130 = local_120 * local_130;
          local_128 = dVar24 * local_120;
          local_120 = local_120 * dVar38;
          local_f8 = &local_180;
          local_f0 = &local_118;
          local_e8 = &local_148;
          if (local_1c8._M_current != iStack_1c0._M_current) {
            lVar25 = (long)iStack_1c0._M_current - (long)local_1c8._M_current;
            local_1a8._0_8_ = local_1c8._M_current;
            ::std::
            __introsort_loop<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                      (local_1c8,
                       (__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                        )iStack_1c0._M_current,(ulong)(uint)((int)LZCOUNT(lVar25 >> 4) * 2) ^ 0x7e,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                        )&local_f8);
            if (lVar25 < 0x101) {
              ::std::
              __insertion_sort<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                        ((__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                          )local_1a8._0_8_,
                         (__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                          )__last._M_current,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                          )&local_f8);
            }
            else {
              __last_00._M_current = (Halfedge *)(local_1a8._0_8_ + 0x100);
              ::std::
              __insertion_sort<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Iter_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                        ((__normal_iterator<geometrycentral::surface::Halfedge_*,_std::vector<geometrycentral::surface::Halfedge,_std::allocator<geometrycentral::surface::Halfedge>_>_>
                          )local_1a8._0_8_,__last_00,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                          )&local_f8);
              for (; __last_00._M_current != __last._M_current;
                  __last_00._M_current = __last_00._M_current + 1) {
                ::std::
                __unguarded_linear_insert<__gnu_cxx::__normal_iterator<geometrycentral::surface::Halfedge*,std::vector<geometrycentral::surface::Halfedge,std::allocator<geometrycentral::surface::Halfedge>>>,__gnu_cxx::__ops::_Val_comp_iter<geometrycentral::surface::buildIntrinsicTuftedCover(geometrycentral::surface::SurfaceMesh&,geometrycentral::MeshData<geometrycentral::surface::Edge,double>&,geometrycentral::surface::EmbeddedGeometryInterface*)::__1>>
                          (__last_00,
                           (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_nmwsharp[P]nonmanifold_laplacian_deps_geometry_central_src_surface_tufted_laplacian_cpp:98:23)>
                            )&local_f8);
              }
            }
          }
        }
        pEVar8 = local_150;
        pPVar18 = ((local_1c8._M_current)->
                  super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                  ).mesh;
        sVar15 = ((local_1c8._M_current)->
                 super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                 ).ind;
        if (pPVar18->useImplicitTwinFlag == true) {
          uVar9 = ~(uint)sVar15 & 1;
        }
        else {
          uVar9 = (uint)(pPVar18->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                        _M_impl.super__Vector_impl_data._M_start[sVar15];
        }
        if (uVar9 != 0) {
          pPVar18 = local_e0.data.
                    super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                    .m_storage.m_data[sVar15].
                    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                    .mesh;
          sVar15 = local_e0.data.
                   super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                   .m_storage.m_data[sVar15].
                   super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   .ind;
        }
        if ((long)iStack_1c0._M_current - (long)local_1c8._M_current != 0) {
          uVar11 = (long)iStack_1c0._M_current - (long)local_1c8._M_current >> 4;
          uVar26 = 0;
          do {
            uVar26 = uVar26 + 1;
            uVar21 = 0;
            if (uVar26 != uVar11) {
              uVar21 = uVar26;
            }
            if (pPVar18->useImplicitTwinFlag == true) {
              uVar9 = ~(uint)sVar15 & 1;
            }
            else {
              uVar9 = (uint)(pPVar18->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start[sVar15];
            }
            pPVar13 = local_1c8._M_current[uVar21].
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .mesh;
            sVar17 = local_1c8._M_current[uVar21].
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind;
            if (pPVar13->useImplicitTwinFlag == true) {
              uVar20 = ~(uint)sVar17 & 1;
            }
            else {
              uVar20 = (uint)(pPVar13->heOrientArr).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start[sVar17];
            }
            if ((uVar20 != 0) == (uVar9 != 0)) {
              pPVar13 = local_e0.data.
                        super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                        .m_storage.m_data[sVar17].
                        super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                        .mesh;
              sVar17 = local_e0.data.
                       super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                       .m_storage.m_data[sVar17].
                       super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                       .ind;
            }
            heA.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind = sVar15;
            heA.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh = pPVar18;
            heB.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .ind = sVar17;
            heB.
            super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
            .mesh = pPVar13;
            EVar53 = SurfaceMesh::separateToNewEdge(mesh,heA,heB);
            local_68.data.super_PlainObjectBase<Eigen::Matrix<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[EVar53.
                   super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                   .ind] = false;
            pdVar4 = (pEVar8->data).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data;
            pdVar4[EVar53.
                   super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                   .ind] = pdVar4[sVar22];
            pPVar18 = local_e0.data.
                      super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                      .m_storage.m_data[sVar17].
                      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                      .mesh;
            sVar15 = local_e0.data.
                     super_PlainObjectBase<Eigen::Matrix<geometrycentral::surface::Halfedge,__1,_1,_0,__1,_1>_>
                     .m_storage.m_data[sVar17].
                     super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                     .ind;
            uVar11 = (long)iStack_1c0._M_current - (long)local_1c8._M_current >> 4;
          } while (uVar26 < uVar11);
        }
        sVar15 = local_158;
        if (local_1c8._M_current != (Halfedge *)0x0) {
          operator_delete(local_1c8._M_current);
          sVar15 = local_158;
        }
      }
      puVar14 = (mesh->eHalfedgeArr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start + sVar22 + 1;
      puVar16 = (mesh->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start + sVar22 * 2 + 2;
      do {
        sVar17 = sVar15;
        if (sVar23 == sVar22) break;
        puVar19 = puVar14;
        if ((mesh->useImplicitTwinFlag & 1U) != 0) {
          puVar19 = puVar16;
        }
        puVar14 = puVar14 + 1;
        puVar16 = puVar16 + 2;
        sVar22 = sVar22 + 1;
        sVar17 = sVar22;
      } while (*puVar19 == 0xffffffffffffffff);
      sVar22 = sVar17;
    } while (sVar17 != sVar15);
  }
  MeshData<geometrycentral::surface::Edge,_bool>::~MeshData(&local_68);
  MeshData<geometrycentral::surface::Face,_bool>::~MeshData(&local_a0);
  MeshData<geometrycentral::surface::Halfedge,_geometrycentral::surface::Halfedge>::~MeshData
            (&local_e0);
  return;
}

Assistant:

void buildIntrinsicTuftedCover(SurfaceMesh& mesh, EdgeData<double>& edgeLengths, EmbeddedGeometryInterface* posGeom) {

  if (posGeom) {
    posGeom->requireVertexPositions();
    posGeom->requireFaceNormals();
  }

  // == Transform the connectivity of the input in to that of the tufted cover

  // Create two copies of each input face
  HalfedgeData<Halfedge> otherSheet(mesh);
  FaceData<bool> isFront(mesh, true); // original copy serves as front
  for (Face fFront : mesh.faces()) {
    if (!isFront[fFront]) continue; // only process original faces

    // create the new face, orient it in the opposite direction
    Face fBack = mesh.duplicateFace(fFront);

    // read off the correspondence bewteen the halfedges, before inverting
    Halfedge heF = fFront.halfedge();
    Halfedge heB = fBack.halfedge();
    do {
      otherSheet[heF] = heB;
      otherSheet[heB] = heF;
      heF = heF.next();
      heB = heB.next();
    } while (heF != fFront.halfedge());

    mesh.invertOrientation(fBack);

    isFront[fBack] = false;
  }


  // Around each edge, glue back faces to front along newly created edges
  EdgeData<bool> isOrigEdge(mesh, true);
  for (Edge e : mesh.edges()) {
    if (!isOrigEdge[e]) continue;

    // Gather the original faces incident on the edge (represented by the halfedge along the edge)
    std::vector<Halfedge> edgeFaces;
    for (Halfedge he : e.adjacentHalfedges()) {
      if (isFront[he.face()]) edgeFaces.push_back(he);
    }

    // If we have normals, use them for an angular sort.
    // Otherwise, just use the "natural" (arbitrary) ordering
    if (posGeom) {

      Vector3 pTail = posGeom->vertexPositions[e.halfedge().tailVertex()];
      Vector3 pTip = posGeom->vertexPositions[e.halfedge().tipVertex()];
      Vector3 edgeVec = pTip - pTail;
      std::array<Vector3, 2> eBasis = edgeVec.buildTangentBasis();

      auto edgeAngle = [&](const Halfedge& he) {
        Vector3 oppVert = posGeom->vertexPositions[he.next().tipVertex()];
        Vector3 outVec = unit(oppVert - pTail);
        return ::std::atan2(dot(std::get<1>(eBasis), outVec), dot(std::get<0>(eBasis), outVec));
      };
      auto sortFunc = [&](const Halfedge& heA, const Halfedge& heB) -> bool { return edgeAngle(heA) > edgeAngle(heB); };

      std::sort(edgeFaces.begin(), edgeFaces.end(), sortFunc);
    }


    // Sequentially connect the faces
    Halfedge currHe = edgeFaces.front();
    if (currHe.orientation()) currHe = otherSheet[currHe];
    for (size_t i = 0; i < edgeFaces.size(); i++) {
      Halfedge nextHe = edgeFaces[(i + 1) % edgeFaces.size()];
      if (currHe.orientation() == nextHe.orientation()) nextHe = otherSheet[nextHe];
      Edge newE = mesh.separateToNewEdge(currHe, nextHe);
      isOrigEdge[newE] = false;
      edgeLengths[newE] = edgeLengths[e];
      currHe = otherSheet[nextHe];
    }
  }

  // sanity checks
  // if (mesh.hasBoundary()) throw std::runtime_error("has boundary");
  // if (!mesh.isEdgeManifold()) throw std::runtime_error("not edge manifold");
  // if (!mesh.isOriented()) throw std::runtime_error("not oriented");
}